

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlSkipBlankChars(xmlParserCtxtPtr ctxt)

{
  bool bVar1;
  int local_1c;
  byte *pbStack_18;
  int res;
  xmlChar *cur;
  xmlParserCtxtPtr ctxt_local;
  
  local_1c = 0;
  pbStack_18 = ctxt->input->cur;
  while( true ) {
    bVar1 = true;
    if ((*pbStack_18 != 0x20) && ((*pbStack_18 < 9 || (bVar1 = true, 10 < *pbStack_18)))) {
      bVar1 = *pbStack_18 == 0xd;
    }
    if (!bVar1) break;
    if (*pbStack_18 == 10) {
      ctxt->input->line = ctxt->input->line + 1;
      ctxt->input->col = 1;
    }
    else {
      ctxt->input->col = ctxt->input->col + 1;
    }
    pbStack_18 = pbStack_18 + 1;
    if (local_1c < 0x7fffffff) {
      local_1c = local_1c + 1;
    }
    if (*pbStack_18 == 0) {
      ctxt->input->cur = pbStack_18;
      xmlParserGrow(ctxt);
      pbStack_18 = ctxt->input->cur;
    }
  }
  ctxt->input->cur = pbStack_18;
  if (((4 < local_1c) && ((ctxt->input->flags & 0x40U) == 0)) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  return local_1c;
}

Assistant:

int
xmlSkipBlankChars(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur;
    int res = 0;

    cur = ctxt->input->cur;
    while (IS_BLANK_CH(*cur)) {
        if (*cur == '\n') {
            ctxt->input->line++; ctxt->input->col = 1;
        } else {
            ctxt->input->col++;
        }
        cur++;
        if (res < INT_MAX)
            res++;
        if (*cur == 0) {
            ctxt->input->cur = cur;
            xmlParserGrow(ctxt);
            cur = ctxt->input->cur;
        }
    }
    ctxt->input->cur = cur;

    if (res > 4)
        GROW;

    return(res);
}